

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O2

int run_test_fs_mkdtemp(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  undefined8 uVar3;
  char *pcVar4;
  
  loop = uv_default_loop();
  iVar1 = uv_fs_mkdtemp(loop,&mkdtemp_req1,"test_dir_XXXXXX",mkdtemp_cb);
  if (iVar1 == 0) {
    uv_run(loop,UV_RUN_DEFAULT);
    if (mkdtemp_cb_count == 1) {
      iVar1 = uv_fs_mkdtemp((uv_loop_t *)0x0,&mkdtemp_req2,"test_dir_XXXXXX",(uv_fs_cb)0x0);
      if (iVar1 == 0) {
        check_mkdtemp_result(&mkdtemp_req2);
        pcVar4 = mkdtemp_req1.path;
        iVar1 = strcmp(mkdtemp_req1.path,mkdtemp_req2.path);
        if (iVar1 == 0) {
          pcVar4 = "strcmp(mkdtemp_req1.path, mkdtemp_req2.path) != 0";
          uVar3 = 0x4d3;
        }
        else {
          rmdir(pcVar4);
          rmdir(mkdtemp_req2.path);
          uv_fs_req_cleanup(&mkdtemp_req1);
          uv_fs_req_cleanup(&mkdtemp_req2);
          puVar2 = uv_default_loop();
          close_loop(puVar2);
          puVar2 = uv_default_loop();
          iVar1 = uv_loop_close(puVar2);
          if (iVar1 == 0) {
            return 0;
          }
          pcVar4 = "0 == uv_loop_close(uv_default_loop())";
          uVar3 = 0x4db;
        }
      }
      else {
        pcVar4 = "r == 0";
        uVar3 = 0x4cf;
      }
    }
    else {
      pcVar4 = "mkdtemp_cb_count == 1";
      uVar3 = 0x4cb;
    }
  }
  else {
    pcVar4 = "r == 0";
    uVar3 = 0x4c8;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
          ,uVar3,pcVar4);
  abort();
}

Assistant:

TEST_IMPL(fs_mkdtemp) {
  int r;
  const char* path_template = "test_dir_XXXXXX";

  loop = uv_default_loop();

  r = uv_fs_mkdtemp(loop, &mkdtemp_req1, path_template, mkdtemp_cb);
  ASSERT(r == 0);

  uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(mkdtemp_cb_count == 1);

  /* sync mkdtemp */
  r = uv_fs_mkdtemp(NULL, &mkdtemp_req2, path_template, NULL);
  ASSERT(r == 0);
  check_mkdtemp_result(&mkdtemp_req2);

  /* mkdtemp return different values on subsequent calls */
  ASSERT(strcmp(mkdtemp_req1.path, mkdtemp_req2.path) != 0);

  /* Cleanup */
  rmdir(mkdtemp_req1.path);
  rmdir(mkdtemp_req2.path);
  uv_fs_req_cleanup(&mkdtemp_req1);
  uv_fs_req_cleanup(&mkdtemp_req2);

  MAKE_VALGRIND_HAPPY();
  return 0;
}